

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_internal.h
# Opt level: O2

ZSTD_sequenceLength ZSTD_getSequenceLength(seqStore_t *seqStore,seqDef *seq)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar1 = seq->litLength;
  uVar2 = (uint)uVar1;
  uVar3 = (ulong)(seq->matchLength + 3);
  if (seqStore->longLengthPos == (U32)((ulong)((long)seq - (long)seqStore->sequencesStart) >> 3)) {
    uVar2 = uVar1 + 0xffff;
    if (seqStore->longLengthType != ZSTD_llt_literalLength) {
      uVar2 = (uint)uVar1;
    }
    if (seqStore->longLengthType == ZSTD_llt_matchLength) {
      uVar3 = (ulong)(seq->matchLength + 0x10002);
    }
  }
  return (ZSTD_sequenceLength)((ulong)uVar2 | uVar3 << 0x20);
}

Assistant:

MEM_STATIC ZSTD_sequenceLength ZSTD_getSequenceLength(seqStore_t const* seqStore, seqDef const* seq)
{
    ZSTD_sequenceLength seqLen;
    seqLen.litLength = seq->litLength;
    seqLen.matchLength = seq->matchLength + MINMATCH;
    if (seqStore->longLengthPos == (U32)(seq - seqStore->sequencesStart)) {
        if (seqStore->longLengthType == ZSTD_llt_literalLength) {
            seqLen.litLength += 0xFFFF;
        }
        if (seqStore->longLengthType == ZSTD_llt_matchLength) {
            seqLen.matchLength += 0xFFFF;
        }
    }
    return seqLen;
}